

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jurassic-jigsaw.cpp
# Opt level: O0

uint64_t __thiscall state_t::magic_number(state_t *this)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  reference pvVar4;
  reference pvVar5;
  uint64_t m;
  state_t *this_local;
  
  pvVar4 = std::
           vector<std::vector<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>,_std::allocator<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>,_std::allocator<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>_>_>_>_>
           ::front(&this->image);
  pvVar5 = std::
           vector<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>,_std::allocator<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>_>_>
           ::front(pvVar4);
  uVar1 = pvVar5->first;
  pvVar4 = std::
           vector<std::vector<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>,_std::allocator<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>,_std::allocator<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>_>_>_>_>
           ::front(&this->image);
  pvVar5 = std::
           vector<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>,_std::allocator<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>_>_>
           ::back(pvVar4);
  uVar2 = pvVar5->first;
  pvVar4 = std::
           vector<std::vector<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>,_std::allocator<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>,_std::allocator<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>_>_>_>_>
           ::back(&this->image);
  pvVar5 = std::
           vector<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>,_std::allocator<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>_>_>
           ::front(pvVar4);
  uVar3 = pvVar5->first;
  pvVar4 = std::
           vector<std::vector<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>,_std::allocator<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>,_std::allocator<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>_>_>_>_>
           ::back(&this->image);
  pvVar5 = std::
           vector<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>,_std::allocator<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>_>_>
           ::back(pvVar4);
  return pvVar5->first * uVar3 * uVar2 * uVar1;
}

Assistant:

uint64_t magic_number() {
    auto m = uint64_t {1};
    m *= image.front().front().first;
    m *= image.front().back().first;
    m *= image.back().front().first;
    m *= image.back().back().first;
    return m;
  }